

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SubD *subd,ON_SimpleArray<ON_COMPONENT_INDEX> *unsorted_edges,
               uint minimum_chain_length,ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges)

{
  uint uVar1;
  ON_COMPONENT_INDEX *pOVar2;
  ON_SubDEdge *local_58;
  ON_SubDEdge *e;
  undefined1 local_48 [4];
  uint i;
  ON_SimpleArray<const_ON_SubDEdge_*> a;
  uint count;
  ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges_local;
  uint minimum_chain_length_local;
  ON_SimpleArray<ON_COMPONENT_INDEX> *unsorted_edges_local;
  ON_SubD *subd_local;
  
  a.m_capacity = ON_SimpleArray<ON_COMPONENT_INDEX>::UnsignedCount(unsorted_edges);
  ON_SimpleArray<const_ON_SubDEdge_*>::ON_SimpleArray
            ((ON_SimpleArray<const_ON_SubDEdge_*> *)local_48,(ulong)(uint)a.m_capacity);
  for (e._4_4_ = 0; e._4_4_ < (uint)a.m_capacity; e._4_4_ = e._4_4_ + 1) {
    pOVar2 = ON_SimpleArray<ON_COMPONENT_INDEX>::operator[](unsorted_edges,e._4_4_);
    local_58 = ON_SubD::EdgeFromComponentIndex(subd,*pOVar2);
    if (local_58 != (ON_SubDEdge *)0x0) {
      ON_SimpleArray<const_ON_SubDEdge_*>::Append
                ((ON_SimpleArray<const_ON_SubDEdge_*> *)local_48,&local_58);
    }
  }
  uVar1 = SortEdgesIntoEdgeChains
                    ((ON_SimpleArray<const_ON_SubDEdge_*> *)local_48,minimum_chain_length,
                     sorted_edges);
  ON_SimpleArray<const_ON_SubDEdge_*>::~ON_SimpleArray
            ((ON_SimpleArray<const_ON_SubDEdge_*> *)local_48);
  return uVar1;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SubD& subd,
  const ON_SimpleArray< ON_COMPONENT_INDEX >& unsorted_edges,
  unsigned int minimum_chain_length,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges
)
{
  const unsigned count = unsorted_edges.UnsignedCount();
  ON_SimpleArray< const ON_SubDEdge* > a(count);
  for (unsigned i = 0; i < count; ++i)
  {
    const ON_SubDEdge* e = subd.EdgeFromComponentIndex(unsorted_edges[i]);
    if (nullptr != e)
      a.Append(e);
  }
  return SortEdgesIntoEdgeChains(a, minimum_chain_length, sorted_edges);
}